

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong mkvparser::Segment::CreateInstance(IMkvReader *pReader,longlong pos,Segment **pSegment)

{
  bool bVar1;
  Segment **ppSVar2;
  int iVar3;
  longlong lVar4;
  ulong uVar5;
  ulong uVar6;
  Segment *pSVar7;
  ulong uVar8;
  ulong pos_00;
  ulong uVar9;
  ulong unaff_R15;
  long len;
  longlong total;
  longlong available;
  long local_50;
  ulong local_48;
  ulong local_40;
  Segment **local_38;
  
  uVar9 = 0xffffffffffffffff;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar3 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_48,&local_40);
    if (iVar3 < 0) {
      uVar9 = (ulong)iVar3;
    }
    else {
      uVar9 = 0xffffffffffffffff;
      if ((-1 < (long)local_40) && (local_38 = pSegment, local_40 <= local_48)) {
        do {
          if ((-1 < (long)local_48) && ((long)local_48 <= pos)) {
            return -2;
          }
          uVar9 = GetUIntLength(pReader,pos,&local_50);
          if (uVar9 == 0) {
            if ((-1 < (long)local_48) && ((long)local_48 < local_50 + pos)) {
              uVar9 = 0xfffffffffffffffe;
              goto LAB_0010f79a;
            }
            uVar9 = local_50 + pos;
            if ((long)local_40 < (long)uVar9) goto LAB_0010f79a;
            lVar4 = ReadID(pReader,pos,&local_50);
            uVar9 = 0xfffffffffffffffe;
            if (lVar4 < 0) {
              bVar1 = false;
            }
            else {
              pos_00 = local_50 + pos;
              uVar5 = GetUIntLength(pReader,pos_00,&local_50);
              if ((uVar5 == 0) &&
                 (((((long)local_48 < 0 ||
                    (uVar5 = uVar9, (long)(local_50 + pos_00) <= (long)local_48)) &&
                   (uVar5 = local_50 + pos_00, (long)(local_50 + pos_00) <= (long)local_40)) &&
                  (uVar6 = ReadUInt(pReader,pos_00,&local_50), ppSVar2 = local_38, uVar5 = uVar6,
                  -1 < (long)uVar6)))) {
                pos_00 = pos_00 + local_50;
                uVar8 = -1L << ((char)local_50 * '\a' & 0x3fU) ^ uVar6;
                if (lVar4 == 0x18538067) {
                  uVar9 = 0xffffffffffffffff;
                  if (((uVar8 != 0xffffffffffffffff) && (-1 < (long)local_48)) &&
                     (uVar9 = uVar6, (long)local_48 < (long)(uVar6 + pos_00))) {
                    uVar9 = 0xffffffffffffffff;
                  }
                  pSVar7 = (Segment *)operator_new(200,(nothrow_t *)&std::nothrow);
                  if (pSVar7 == (Segment *)0x0) {
                    pSVar7 = (Segment *)0x0;
                  }
                  else {
                    pSVar7->m_pReader = pReader;
                    pSVar7->m_element_start = pos;
                    pSVar7->m_start = pos_00;
                    pSVar7->m_size = uVar9;
                    (pSVar7->m_eos).m_pSegment = (Segment *)0x0;
                    (pSVar7->m_eos).m_element_start = 0;
                    (pSVar7->m_eos).m_index = 0;
                    (pSVar7->m_eos).m_pos = 0;
                    (pSVar7->m_eos).m_element_size = 0;
                    (pSVar7->m_eos).m_timecode = 0;
                    (pSVar7->m_eos).m_entries = (BlockEntry **)0x0;
                    (pSVar7->m_eos).m_entries_size = 0;
                    (pSVar7->m_eos).m_entries_count = 0;
                    pSVar7->m_pos = pos_00;
                    pSVar7->m_pUnknownSize = (Cluster *)0x0;
                    pSVar7->m_pSeekHead = (SeekHead *)0x0;
                    pSVar7->m_pInfo = (SegmentInfo *)0x0;
                    pSVar7->m_pTracks = (Tracks *)0x0;
                    pSVar7->m_pCues = (Cues *)0x0;
                    pSVar7->m_pChapters = (Chapters *)0x0;
                    pSVar7->m_pTags = (Tags *)0x0;
                    pSVar7->m_clusters = (Cluster **)0x0;
                    pSVar7->m_clusterCount = 0;
                    pSVar7->m_clusterPreloadCount = 0;
                    pSVar7->m_clusterSize = 0;
                  }
                  *ppSVar2 = pSVar7;
                  bVar1 = false;
                  pos = pos_00;
                  uVar9 = -(ulong)(pSVar7 == (Segment *)0x0);
                }
                else {
                  uVar5 = uVar9;
                  if (uVar8 == 0xffffffffffffffff) goto LAB_0010f81a;
                  uVar6 = uVar6 + pos_00;
                  if (((long)local_48 < 0) || ((long)uVar6 <= (long)local_48)) {
                    pos = pos_00;
                    if ((long)uVar6 <= (long)local_40) {
                      pos = uVar6;
                    }
                    bVar1 = (long)uVar6 <= (long)local_40;
                    uVar9 = unaff_R15;
                    if ((long)local_40 < (long)uVar6) {
                      uVar9 = uVar6;
                    }
                  }
                  else {
                    bVar1 = false;
                    pos = pos_00;
                  }
                }
              }
              else {
LAB_0010f81a:
                bVar1 = false;
                pos = pos_00;
                uVar9 = uVar5;
              }
            }
          }
          else {
LAB_0010f79a:
            bVar1 = false;
          }
          unaff_R15 = uVar9;
        } while (bVar1);
      }
    }
  }
  return uVar9;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}